

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Block_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::ByteSizeLong(MapEntryImpl<CoreML::Specification::MILSpec::Block_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
               *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  undefined4 extraout_var_00;
  size_t sVar3;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  sVar2 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
  sVar3 = WireFormatLite::MessageSizeNoVirtual<CoreML::Specification::MILSpec::Value>
                    ((Value *)CONCAT44(extraout_var_00,iVar1));
  return sVar3 + (long)(int)sVar2 + 2;
}

Assistant:

size_t ByteSizeLong() const override {
    size_t size = 0;
    size += kTagSize + static_cast<size_t>(KeyTypeHandler::ByteSize(key()));
    size += kTagSize + static_cast<size_t>(ValueTypeHandler::ByteSize(value()));
    return size;
  }